

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_compareScalingFactorWithTwoUnitsBasedOnUnknownUnits_Test::
~Units_compareScalingFactorWithTwoUnitsBasedOnUnknownUnits_Test
          (Units_compareScalingFactorWithTwoUnitsBasedOnUnknownUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, compareScalingFactorWithTwoUnitsBasedOnUnknownUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("apple", 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("banana", 0, 1.0, 1.0);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
}